

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<nwcpp::BinaryOp,_nwcpp::Node> * __thiscall
pybind11::class_<nwcpp::BinaryOp,nwcpp::Node>::def<std::__cxx11::string(*)(nwcpp::BinaryOp_const&)>
          (class_<nwcpp::BinaryOp,nwcpp::Node> *this,char *name_,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_BinaryOp_ptr **f)

{
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_BinaryOp_ptr *f_00;
  cpp_function cf;
  handle local_50;
  cpp_function local_48;
  object local_40;
  is_method local_38;
  name local_30;
  sibling local_28;
  
  f_00 = *f;
  local_38.class_.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_30.value = name_;
  local_50.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_50.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_50.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_28.value.m_ptr = (handle)(handle)local_50.m_ptr;
  cpp_function::
  cpp_function<std::__cxx11::string,nwcpp::BinaryOp_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_48,f_00,&local_30,&local_38,&local_28);
  object::~object((object *)&local_50);
  object::~object(&local_40);
  detail::add_class_method((object *)this,name_,&local_48);
  object::~object((object *)&local_48);
  return (class_<nwcpp::BinaryOp,_nwcpp::Node> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }